

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_unprocessed_extensions
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_size *out_extensions_count,cgltf_extension **out_extensions)

{
  int iVar1;
  cgltf_size cVar2;
  cgltf_extension *pcVar3;
  cgltf_extension *extension;
  cgltf_size extension_index;
  int j;
  int extensions_size;
  cgltf_extension **out_extensions_local;
  cgltf_size *out_extensions_count_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  if (tokens[i + 1].type == JSMN_OBJECT) {
    if (*out_extensions == (cgltf_extension *)0x0) {
      iVar1 = tokens[i + 1].size;
      *out_extensions_count = 0;
      pcVar3 = (cgltf_extension *)cgltf_calloc(options,0x10,(long)iVar1);
      *out_extensions = pcVar3;
      if (*out_extensions == (cgltf_extension *)0x0) {
        options_local._4_4_ = -2;
      }
      else {
        json_chunk_local._4_4_ = i + 2;
        for (extension_index._0_4_ = 0; (int)extension_index < iVar1;
            extension_index._0_4_ = (int)extension_index + 1) {
          if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
             (tokens[json_chunk_local._4_4_].size == 0)) {
            return -1;
          }
          cVar2 = *out_extensions_count;
          *out_extensions_count = cVar2 + 1;
          json_chunk_local._4_4_ =
               cgltf_parse_json_unprocessed_extension
                         (options,tokens,json_chunk_local._4_4_,json_chunk,*out_extensions + cVar2);
          if (json_chunk_local._4_4_ < 0) {
            return json_chunk_local._4_4_;
          }
        }
        options_local._4_4_ = json_chunk_local._4_4_;
      }
    }
    else {
      options_local._4_4_ = -1;
    }
  }
  else {
    options_local._4_4_ = -1;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_unprocessed_extensions(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_size* out_extensions_count, cgltf_extension** out_extensions)
{
	++i;

	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	if(*out_extensions)
	{
		return CGLTF_ERROR_JSON;
	}

	int extensions_size = tokens[i].size;
	*out_extensions_count = 0;
	*out_extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

	if (!*out_extensions)
	{
		return CGLTF_ERROR_NOMEM;
	}

	++i;

	for (int j = 0; j < extensions_size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		cgltf_size extension_index = (*out_extensions_count)++;
		cgltf_extension* extension = &((*out_extensions)[extension_index]);
		i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, extension);

		if (i < 0)
		{
			return i;
		}
	}
	return i;
}